

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O1

optional<pbrt::ShapeIntersection> * __thiscall
pbrt::BilinearPatch::Intersect
          (optional<pbrt::ShapeIntersection> *__return_storage_ptr__,BilinearPatch *this,Ray *ray,
          Float tMax)

{
  ulong uVar1;
  BilinearPatchMesh *mesh;
  int *piVar2;
  Point3f *pPVar3;
  long lVar4;
  undefined1 auVar5 [16];
  optional<pbrt::BilinearIntersection> blpIsect;
  SurfaceInteraction intr;
  Tuple2<pbrt::Point2,_float> local_140;
  float local_138;
  char local_134;
  Tuple3<pbrt::Vector3,_float> local_130;
  SurfaceInteraction local_120;
  
  mesh = *(BilinearPatchMesh **)(*(long *)(allMeshes + 8) + (long)this->meshIndex * 8);
  lVar4 = (long)this->blpIndex;
  piVar2 = mesh->vertexIndices;
  pPVar3 = mesh->p;
  IntersectBilinearPatch
            ((Ray *)&local_140,tMax,&ray->o,pPVar3 + piVar2[lVar4 * 4],
             pPVar3 + piVar2[lVar4 * 4 + 1],pPVar3 + piVar2[lVar4 * 4 + 2]);
  if (local_134 == '\0') {
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xc0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 200) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
  }
  else {
    uVar1._0_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar1._4_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
    auVar5._0_8_ = uVar1 ^ 0x8000000080000000;
    auVar5._8_4_ = 0x80000000;
    auVar5._12_4_ = 0x80000000;
    local_130.z = -(ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
    local_130._0_8_ = vmovlps_avx(auVar5);
    InteractionFromIntersection
              (&local_120,mesh,this->blpIndex,(Point2f)local_140,ray->time,(Vector3f *)&local_130);
    if (local_134 == '\0') {
      LogFatal<char_const(&)[4]>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                 ,0xea,"Check failed: %s",(char (*) [4])0x2813e7c);
    }
    __return_storage_ptr__->set = true;
    (__return_storage_ptr__->optionalValue).__align =
         (anon_struct_8_0_00000001_for___align)
         local_120.super_Interaction.pi.super_Point3<pbrt::Interval>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval>.x;
    *(Interval *)((long)&__return_storage_ptr__->optionalValue + 8) =
         local_120.super_Interaction.pi.super_Point3<pbrt::Interval>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval>.y;
    *(Interval *)((long)&__return_storage_ptr__->optionalValue + 0x10) =
         local_120.super_Interaction.pi.super_Point3<pbrt::Interval>.
         super_Tuple3<pbrt::Point3,_pbrt::Interval>.z;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) =
         local_120.super_Interaction._24_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) =
         local_120.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) =
         local_120.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) =
         local_120.super_Interaction._48_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) =
         local_120.super_Interaction._56_8_;
    *(MediumInterface **)((long)&__return_storage_ptr__->optionalValue + 0x40) =
         local_120.super_Interaction.mediumInterface;
    ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
      *)((long)&__return_storage_ptr__->optionalValue + 0x48))->bits =
         (uintptr_t)
         local_120.super_Interaction.medium.
         super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
         .bits;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) =
         local_120.dpdu.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = local_120._88_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) =
         local_120.dpdv.super_Tuple3<pbrt::Vector3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) =
         local_120.dndu.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x70) = local_120._112_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x78) =
         local_120.dndv.super_Tuple3<pbrt::Normal3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) =
         local_120.shading.n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = local_120.shading._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x80) =
         local_120.shading.n.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x88) = local_120.shading._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x90) =
         local_120.shading.dpdu.super_Tuple3<pbrt::Vector3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x98) =
         local_120.shading.dpdv.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa0) = local_120.shading._32_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xa8) =
         local_120.shading.dndu.super_Tuple3<pbrt::Normal3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb0) =
         local_120.shading.dndv.super_Tuple3<pbrt::Normal3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xb8) = local_120._184_8_;
    ((TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
      *)((long)&__return_storage_ptr__->optionalValue + 0xc0))->bits =
         (uintptr_t)
         local_120.material.
         super_TaggedPointer<pbrt::CoatedDiffuseMaterial,_pbrt::CoatedConductorMaterial,_pbrt::ConductorMaterial,_pbrt::DielectricMaterial,_pbrt::DiffuseMaterial,_pbrt::DiffuseTransmissionMaterial,_pbrt::HairMaterial,_pbrt::MeasuredMaterial,_pbrt::SubsurfaceMaterial,_pbrt::ThinDielectricMaterial,_pbrt::MixMaterial>
         .bits;
    ((TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
      *)((long)&__return_storage_ptr__->optionalValue + 200))->bits =
         (uintptr_t)
         local_120.areaLight.
         super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
         .bits;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xf0) = local_120._240_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd0) =
         local_120.dpdx.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xd8) = local_120._216_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe0) =
         local_120.dpdy.super_Tuple3<pbrt::Vector3,_float>._4_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0xe8) = local_120._232_8_;
    *(float *)((long)&__return_storage_ptr__->optionalValue + 0xf8) = local_138;
  }
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<ShapeIntersection> BilinearPatch::Intersect(const Ray &ray,
                                                           Float tMax) const {
    // Get bilinear patch vertices in _p00_, _p01_, _p10_, and _p11_
    const BilinearPatchMesh *mesh = GetMesh();
    const int *v = &mesh->vertexIndices[4 * blpIndex];
    const Point3f &p00 = mesh->p[v[0]], &p10 = mesh->p[v[1]];
    const Point3f &p01 = mesh->p[v[2]], &p11 = mesh->p[v[3]];

    pstd::optional<BilinearIntersection> blpIsect =
        IntersectBilinearPatch(ray, tMax, p00, p10, p01, p11);
    if (!blpIsect)
        return {};
    SurfaceInteraction intr =
        InteractionFromIntersection(mesh, blpIndex, blpIsect->uv, ray.time, -ray.d);
    return ShapeIntersection{intr, blpIsect->t};
}